

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_priority_change_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  char *pcVar5;
  resp_msg *in_RSI;
  long in_RDI;
  string local_30 [32];
  resp_msg *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f603e);
    iVar2 = (*peVar4->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1f6061);
      uVar3 = msg_base::get_src(&local_10->super_msg_base);
      bVar1 = resp_msg::get_accepted(local_10);
      pcVar5 = "fail";
      if (bVar1) {
        pcVar5 = "success";
      }
      msg_if_given_abi_cxx11_((char *)local_30,"got response from peer %d: %s",(ulong)uVar3,pcVar5);
      (*peVar4->_vptr_logger[8])
                (peVar4,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                 ,"handle_priority_change_resp",0xcb,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  return;
}

Assistant:

void raft_server::handle_priority_change_resp(resp_msg& resp) {
    p_in("got response from peer %d: %s",
         resp.get_src(),
         resp.get_accepted() ? "success" : "fail");
}